

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec,uchar *tweak)

{
  int iVar1;
  uint uVar2;
  int overflow;
  int local_44;
  secp256k1_scalar local_40;
  
  local_44 = 0;
  secp256k1_scalar_set_b32(&local_40,tweak,&local_44);
  iVar1 = local_44;
  secp256k1_scalar_add(sec,sec,&local_40);
  uVar2 = secp256k1_scalar_is_zero(sec);
  uVar2 = uVar2 ^ 1;
  if (iVar1 != 0) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec, const unsigned char *tweak) {
    secp256k1_scalar term;
    int overflow = 0;
    int ret = 0;

    secp256k1_scalar_set_b32(&term, tweak, &overflow);
    ret = (!overflow) & secp256k1_eckey_privkey_tweak_add(sec, &term);
    secp256k1_scalar_clear(&term);
    return ret;
}